

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.c
# Opt level: O1

argparse_result_t argparse_exec(int argc,char **argv,argparse_callback_fn *callback)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  adt_error_t aVar4;
  char cVar5;
  int32_t iVar6;
  argparse_result_t aVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  uint uVar11;
  long lVar12;
  char *pcVar13;
  bool bVar14;
  adt_str_t long_name;
  adt_str_t short_name;
  adt_str_t str;
  argparse_result_t local_ac;
  adt_str_t local_88;
  adt_str_t local_70;
  ulong local_58;
  ulong local_50;
  adt_str_t local_48;
  
  aVar7 = ARGPARSE_SUCCESS;
  if ((1 < argc) &&
     (aVar7 = ARGPARSE_INVALID_ARGUMENT_ERROR,
     callback != (argparse_callback_fn *)0x0 && argv != (char **)0x0)) {
    adt_str_create(&local_48);
    adt_str_create(&local_70);
    adt_str_create(&local_88);
    local_58 = (ulong)(uint)argc;
    uVar8 = 1;
    bVar1 = false;
    bVar2 = false;
    do {
      pcVar13 = argv[uVar8];
      local_50 = uVar8;
      adt_str_clear(&local_48);
      if (*pcVar13 == '-') {
        lVar12 = 0;
        do {
          lVar3 = lVar12 + 1;
          lVar12 = lVar12 + 1;
        } while (pcVar13[lVar3] == '-');
        pcVar13 = pcVar13 + lVar12;
        pcVar10 = pcVar13;
      }
      else {
        lVar12 = 0;
        pcVar10 = pcVar13;
      }
      while( true ) {
        pcVar10 = pcVar10 + 1;
        cVar5 = *pcVar13;
        if ((cVar5 == '\0') || (cVar5 == '=')) break;
        adt_str_push(&local_48,(int)cVar5);
        pcVar13 = pcVar13 + 1;
      }
      bVar14 = cVar5 == '=';
      iVar6 = adt_str_length(&local_48);
      uVar11 = (uint)lVar12;
      if (uVar11 < 3 && 0 < iVar6) {
        if (uVar11 == 2) {
          if (cVar5 != '=') {
            pcVar13 = adt_str_cstr(&local_48);
            aVar7 = (*callback)((char *)0x0,pcVar13,(char *)0x0);
            if (aVar7 == ARGPARSE_NEED_VALUE) {
              aVar4 = adt_str_set(&local_88,&local_48);
              if (aVar4 != '\0') {
                adt_str_destroy(&local_48);
                adt_str_destroy(&local_70);
                adt_str_destroy(&local_88);
                local_ac = ARGPARSE_MEM_ERROR;
              }
              bVar2 = true;
LAB_0013b4e5:
              if (aVar4 != '\0') {
                bVar14 = false;
                goto LAB_0013b665;
              }
              aVar7 = ARGPARSE_NEED_VALUE;
            }
            goto LAB_0013b581;
          }
          aVar4 = adt_str_set(&local_88,&local_48);
          if (aVar4 == '\0') {
            adt_str_clear(&local_48);
            cVar5 = pcVar13[bVar14];
            if (cVar5 != '\0') {
              pcVar10 = pcVar10 + bVar14;
              do {
                adt_str_push(&local_48,(int)cVar5);
                cVar5 = *pcVar10;
                pcVar10 = pcVar10 + 1;
              } while (cVar5 != '\0');
            }
            pcVar13 = adt_str_cstr(&local_88);
            pcVar10 = adt_str_cstr(&local_48);
            aVar7 = (*callback)((char *)0x0,pcVar13,pcVar10);
          }
          else {
            adt_str_destroy(&local_48);
            adt_str_destroy(&local_70);
            adt_str_destroy(&local_88);
            local_ac = ARGPARSE_MEM_ERROR;
            aVar7 = ARGPARSE_PARSE_ERROR;
          }
          if (aVar4 == '\0') goto LAB_0013b581;
LAB_0013b65e:
          bVar14 = false;
        }
        else {
          if (uVar11 == 1) {
            if (cVar5 == '=') {
              aVar4 = adt_str_set(&local_70,&local_48);
              if (aVar4 == '\0') {
                adt_str_clear(&local_48);
                cVar5 = pcVar13[bVar14];
                if (cVar5 != '\0') {
                  pcVar10 = pcVar10 + bVar14;
                  do {
                    adt_str_push(&local_48,(int)cVar5);
                    cVar5 = *pcVar10;
                    pcVar10 = pcVar10 + 1;
                  } while (cVar5 != '\0');
                }
                pcVar13 = adt_str_cstr(&local_70);
                pcVar10 = adt_str_cstr(&local_48);
                aVar7 = (*callback)(pcVar13,(char *)0x0,pcVar10);
              }
              else {
                adt_str_destroy(&local_48);
                adt_str_destroy(&local_70);
                adt_str_destroy(&local_88);
                local_ac = ARGPARSE_MEM_ERROR;
                aVar7 = ARGPARSE_PARSE_ERROR;
              }
              if (aVar4 != '\0') goto LAB_0013b65e;
            }
            else {
              pcVar13 = adt_str_cstr(&local_48);
              aVar7 = (*callback)(pcVar13,(char *)0x0,(char *)0x0);
              if (aVar7 == ARGPARSE_NEED_VALUE) {
                aVar4 = adt_str_set(&local_70,&local_48);
                if (aVar4 != '\0') {
                  adt_str_destroy(&local_48);
                  adt_str_destroy(&local_70);
                  adt_str_destroy(&local_88);
                  local_ac = ARGPARSE_MEM_ERROR;
                }
                bVar1 = true;
                goto LAB_0013b4e5;
              }
            }
            goto LAB_0013b581;
          }
          if (bVar1) {
            pcVar13 = adt_str_cstr(&local_70);
            pcVar10 = adt_str_cstr(&local_48);
            bVar1 = false;
LAB_0013b571:
            pcVar9 = (char *)0x0;
          }
          else {
            if (!bVar2) {
              pcVar10 = adt_str_cstr(&local_48);
              pcVar13 = (char *)0x0;
              goto LAB_0013b571;
            }
            pcVar9 = adt_str_cstr(&local_88);
            pcVar10 = adt_str_cstr(&local_48);
            bVar2 = false;
            pcVar13 = (char *)0x0;
          }
          aVar7 = (*callback)(pcVar13,pcVar9,pcVar10);
LAB_0013b581:
          bVar14 = true;
          if (aVar7 < ARGPARSE_SUCCESS) {
            adt_str_destroy(&local_48);
            adt_str_destroy(&local_70);
            adt_str_destroy(&local_88);
            bVar14 = false;
            local_ac = aVar7;
          }
        }
LAB_0013b665:
        if (bVar14) {
LAB_0013b55c:
          bVar14 = true;
        }
        else {
LAB_0013b66d:
          bVar14 = false;
        }
      }
      else {
        if (iVar6 == 0 && uVar11 == 1) {
          if (bVar1) {
            pcVar13 = adt_str_cstr(&local_70);
            bVar1 = false;
LAB_0013b523:
            pcVar10 = (char *)0x0;
          }
          else {
            if (!bVar2) {
              pcVar13 = (char *)0x0;
              goto LAB_0013b523;
            }
            pcVar10 = adt_str_cstr(&local_88);
            bVar2 = false;
            pcVar13 = (char *)0x0;
          }
          aVar7 = (*callback)(pcVar13,pcVar10,"-");
          if (aVar7 < ARGPARSE_SUCCESS) {
            adt_str_destroy(&local_48);
            adt_str_destroy(&local_70);
            adt_str_destroy(&local_88);
            local_ac = aVar7;
          }
          if (ARGPARSE_NAME_ERROR < aVar7) goto LAB_0013b55c;
          goto LAB_0013b66d;
        }
        adt_str_destroy(&local_48);
        adt_str_destroy(&local_70);
        adt_str_destroy(&local_88);
        local_ac = ARGPARSE_PARSE_ERROR;
        bVar14 = false;
      }
      if (!bVar14) {
        return local_ac;
      }
      uVar8 = local_50 + 1;
    } while (uVar8 != local_58);
    adt_str_destroy(&local_48);
    adt_str_destroy(&local_70);
    adt_str_destroy(&local_88);
    aVar7 = ARGPARSE_SUCCESS;
  }
  return aVar7;
}

Assistant:

argparse_result_t argparse_exec(int argc, const char **argv, argparse_callback_fn *callback)
{
   if ( argc < 2)
   {
      return ARGPARSE_SUCCESS; //Nothing to parse
   }
   if ( (argv != 0) && (callback != 0) )
   {
      int arg_id;
      adt_str_t short_name;
      adt_str_t long_name;
      adt_str_t str;
      bool has_short_name = false;
      bool has_long_name = false;
      adt_str_create(&str);
      adt_str_create(&short_name);
      adt_str_create(&long_name);

      for (arg_id = 1; arg_id < argc; arg_id++)
      {
         char c;
         int arg_len;
         unsigned int minus_count = 0u;
         unsigned int equal_count = 0u;
         const char *p = argv[arg_id];
         adt_str_clear(&str);
         for(c= *p; c == '-'; c = *(++p))
         {
            minus_count++;
         }
         for(c = *p; (c != '\0') && (c != '='); c = *(++p))
         {
            adt_str_push(&str, c);
         }
         if (c == '=')
         {
            equal_count++;
            p++;
         }
         arg_len = adt_str_length(&str);
         if ( (arg_len > 0) && (minus_count <= 2u))
         {
            argparse_result_t result = ARGPARSE_PARSE_ERROR;
            switch(minus_count)
            {
            case 0u:
               if (has_short_name)
               {
                  has_short_name = false;
                  result = callback(adt_str_cstr(&short_name), (const char*) 0, adt_str_cstr(&str));
               }
               else if (has_long_name)
               {
                  has_long_name = false;
                  result = callback((const char*) 0, adt_str_cstr(&long_name), adt_str_cstr(&str));
               }
               else
               {
                  //positional argument
                  result = callback((const char*) 0, (const char*) 0, adt_str_cstr(&str));
               }
               break;
            case 1u:
               if (equal_count == 0)
               {
                  result = callback(adt_str_cstr(&str), (const char*) 0, (const char*) 0);
                  if (result == ARGPARSE_NEED_VALUE)
                  {
                     adt_error_t rc = adt_str_set(&short_name, &str);
                     has_short_name = true;
                     if (rc != ADT_NO_ERROR)
                     {
                        ARGPARSE_DESTROY_VARS();
                        return ARGPARSE_MEM_ERROR;
                     }
                  }
               }
               else if (equal_count == 1)
               {
                  adt_error_t rc = adt_str_set(&short_name, &str);
                  if (rc != ADT_NO_ERROR)
                  {
                     ARGPARSE_DESTROY_VARS();
                     return ARGPARSE_MEM_ERROR;
                  }
                  adt_str_clear(&str);
                  for(c = *p; (c != '\0') ; c = *(++p))
                  {
                     adt_str_push(&str, c);
                  }
                  result = callback(adt_str_cstr(&short_name), (const char*) 0, adt_str_cstr(&str));
               }
               else
               {
                  //parse error already set as default
               }
               break;
            case 2u:
               if (equal_count==0)
               {
                  result = callback((const char*) 0, adt_str_cstr(&str), (const char*) 0);
                  if (result == ARGPARSE_NEED_VALUE)
                  {
                     adt_error_t rc = adt_str_set(&long_name, &str);
                     has_long_name = true;
                     if (rc != ADT_NO_ERROR)
                     {
                        ARGPARSE_DESTROY_VARS();
                        return ARGPARSE_MEM_ERROR;
                     }
                  }
               }
               else if (equal_count == 1)
               {
                  adt_error_t rc = adt_str_set(&long_name, &str);
                  if (rc != ADT_NO_ERROR)
                  {
                     ARGPARSE_DESTROY_VARS();
                     return ARGPARSE_MEM_ERROR;
                  }
                  adt_str_clear(&str);
                  for(c = *p; (c != '\0') ; c = *(++p))
                  {
                     adt_str_push(&str, c);
                  }
                  result = callback((const char*) 0, adt_str_cstr(&long_name), adt_str_cstr(&str));
               }
               else
               {
                  //parse error already set as default
               }
               break;
            }
            if (result < 0)
            {
               ARGPARSE_DESTROY_VARS();
               return result;
            }
         }
         else if ((arg_len == 0) && (minus_count == 1))
         {
            /* A standalone minus sign is sometimes used as a positional argument to mean
               stdin/stdout instead of a file name. */

            argparse_result_t result;
            if (has_short_name)
            {
               has_short_name = false;
               result = callback(adt_str_cstr(&short_name), (const char*) 0, "-");
            }
            else if (has_long_name)
            {
               has_long_name = false;
               result = callback((const char*) 0, adt_str_cstr(&long_name), "-");
            }
            else
            {
               result = callback((const char*) 0, (const char*) 0, "-");
            }

            if (result < 0)
            {
               ARGPARSE_DESTROY_VARS();
               return result;
            }
         }
         else
         {
            //User gave empty arg or just typed minus sign(s) with nothing following it or typed three or more minus signs.
            ARGPARSE_DESTROY_VARS();
            return ARGPARSE_PARSE_ERROR;
         }
      }
      ARGPARSE_DESTROY_VARS();
      return ARGPARSE_SUCCESS;
   }
   return ARGPARSE_INVALID_ARGUMENT_ERROR;
}